

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  cmState *this_00;
  char *pcVar6;
  undefined1 local_100 [8];
  string notfound;
  undefined1 local_d8 [8];
  string library;
  string local_b0;
  allocator local_89;
  string local_88 [8];
  string abi;
  allocator local_51;
  string local_50;
  char *local_30;
  char *abi_name;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsIn_local;
  cmFindLibraryCommand *this_local;
  
  abi_name = &param_2->ReturnInvoked;
  param_2_local = (cmExecutionStatus *)argsIn;
  argsIn_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).VariableDocumentation,"Path to a library.");
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName,"LIBRARY");
  uVar3 = (*(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.super_cmObject.
            _vptr_cmObject[0xc])(this,param_2_local);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else if (((this->super_cmFindBase).AlreadyInCache & 1U) == 0) {
    pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"CMAKE_INTERNAL_PLATFORM_ABI",&local_51);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_30 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar4,&local_89);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      lVar5 = std::__cxx11::string::find((char *)local_88,0x9935db);
      if (lVar5 != -1) {
        AddArchitecturePaths(this,"32");
      }
      std::__cxx11::string::~string(local_88);
    }
    this_00 = cmMakefile::GetState
                        ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b0,"FIND_LIBRARY_USE_LIB64_PATHS",
               (allocator *)(library.field_2._M_local_buf + 0xf));
    bVar2 = cmState::GetGlobalPropertyAsBool(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)(library.field_2._M_local_buf + 0xf));
    if ((bVar2) &&
       (bVar2 = cmMakefile::PlatformIs64Bit
                          ((this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile),
       bVar2)) {
      AddArchitecturePaths(this,"64");
    }
    FindLibrary_abi_cxx11_((string *)local_d8,this);
    bVar2 = std::operator!=((string *)local_d8,"");
    if (bVar2) {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,pcVar4,pcVar6,FILEPATH,false);
      this_local._7_1_ = 1;
      notfound.field_2._12_4_ = 1;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     &(this->super_cmFindBase).VariableName,"-NOTFOUND");
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,pcVar4,pcVar6,FILEPATH,false);
      this_local._7_1_ = 1;
      notfound.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_100);
    }
    std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    if (((this->super_cmFindBase).AlreadyInCacheWithoutMetaInfo & 1U) != 0) {
      pcVar1 = (this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (pcVar1,&(this->super_cmFindBase).VariableName,"",pcVar4,FILEPATH,false);
    }
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindLibraryCommand
::InitialPass(std::vector<std::string> const& argsIn, cmExecutionStatus &)
{
  this->VariableDocumentation = "Path to a library.";
  this->CMakePathName = "LIBRARY";
  if(!this->ParseArguments(argsIn))
    {
    return false;
    }
  if(this->AlreadyInCache)
    {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if(this->AlreadyInCacheWithoutMetaInfo)
      {
      this->Makefile->AddCacheDefinition(this->VariableName, "",
                                         this->VariableDocumentation.c_str(),
                                         cmState::FILEPATH);
      }
    return true;
    }

  if(const char* abi_name =
     this->Makefile->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI"))
    {
    std::string abi = abi_name;
    if(abi.find("ELF N32") != abi.npos)
      {
      // Convert lib to lib32.
      this->AddArchitecturePaths("32");
      }
    }

  if(this->Makefile->GetState()
         ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_LIB64_PATHS"))
    {
    // add special 64 bit paths if this is a 64 bit compile.
    if(this->Makefile->PlatformIs64Bit())
      {
      this->AddArchitecturePaths("64");
      }
    }

  std::string library = this->FindLibrary();
  if(library != "")
    {
    // Save the value in the cache
    this->Makefile->AddCacheDefinition(this->VariableName,
                                       library.c_str(),
                                       this->VariableDocumentation.c_str(),
                                       cmState::FILEPATH);
    return true;
    }
  std::string notfound = this->VariableName + "-NOTFOUND";
  this->Makefile->AddCacheDefinition(this->VariableName,
                                     notfound.c_str(),
                                     this->VariableDocumentation.c_str(),
                                     cmState::FILEPATH);
  return true;
}